

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O2

void __thiscall CDBWrapper::CDBWrapper(CDBWrapper *this,DBParams *params)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value;
  ulong uVar1;
  pointer puVar2;
  bool bVar3;
  LevelDBContext *pLVar4;
  Env *pEVar5;
  LevelDBContext *pLVar6;
  long lVar7;
  Level level;
  DBParams *pDVar8;
  Options *pOVar9;
  string *this_00;
  LogFlags category;
  Options *pOVar10;
  long in_FS_OFFSET;
  byte bVar11;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  vector<unsigned_char,_std::allocator<unsigned_char>_> new_key;
  Status status;
  Status result;
  Options options;
  path local_60;
  long local_38;
  
  bVar11 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<LevelDBContext>();
  std::filesystem::__cxx11::path::stem(&local_60,(path *)params);
  std::filesystem::__cxx11::path::path((path *)&options,&local_60);
  std::filesystem::__cxx11::path::string(&this->m_name,(path *)&options);
  std::filesystem::__cxx11::path::~path((path *)&options);
  std::filesystem::__cxx11::path::~path(&local_60);
  value = &this->obfuscate_key;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar8 = params;
  std::filesystem::__cxx11::path::path(&(this->m_path).super_path,(path *)params);
  level = (Level)pDVar8;
  this->m_is_memory = params->memory_only;
  pLVar4 = DBContext(this);
  pLVar4->penv = (Env *)0x0;
  pLVar4 = DBContext(this);
  (pLVar4->readoptions).verify_checksums = true;
  pLVar4 = DBContext(this);
  (pLVar4->iteroptions).verify_checksums = true;
  pLVar4 = DBContext(this);
  (pLVar4->iteroptions).fill_cache = false;
  pLVar4 = DBContext(this);
  (pLVar4->syncoptions).sync = true;
  uVar1 = params->cache_bytes;
  leveldb::Options::Options(&options);
  options.block_cache = leveldb::NewLRUCache(uVar1 >> 1);
  options.write_buffer_size = uVar1 >> 2;
  options.filter_policy = leveldb::NewBloomFilterPolicy(10);
  options.compression = kNoCompression;
  category = HTTP;
  options.info_log = (Logger *)operator_new(8);
  (options.info_log)->_vptr_Logger = (_func_int **)&PTR__Logger_01141918;
  options.paranoid_checks = true;
  result.state_._0_4_ = options.max_open_files;
  bVar3 = ::LogAcceptCategory(category,level);
  if (bVar3) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
    ;
    source_file._M_len = 0x5d;
    logging_function._M_str = "SetMaxOpenFiles";
    logging_function._M_len = 0xf;
    LogPrintFormatInternal<int,int>
              (logging_function,source_file,0x86,LEVELDB,Debug,(ConstevalFormatString<2U>)0xc8d4f1,
               &options.max_open_files,(int *)&result);
  }
  pLVar4 = DBContext(this);
  pOVar9 = &options;
  pOVar10 = &pLVar4->options;
  for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
    pOVar10->comparator = pOVar9->comparator;
    pOVar9 = (Options *)((long)pOVar9 + (ulong)bVar11 * -0x10 + 8);
    pOVar10 = (Options *)((long)pOVar10 + (ulong)bVar11 * -0x10 + 8);
  }
  pLVar4 = DBContext(this);
  (pLVar4->options).create_if_missing = true;
  if (params->memory_only == true) {
    pEVar5 = leveldb::Env::Default();
    pEVar5 = leveldb::NewMemEnv(pEVar5);
    pLVar4 = DBContext(this);
    pLVar4->penv = pEVar5;
    pLVar4 = DBContext(this);
    pEVar5 = pLVar4->penv;
    pLVar4 = DBContext(this);
    (pLVar4->options).env = pEVar5;
  }
  else {
    if (params->wipe_data == true) {
      std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
      ;
      source_file_00._M_len = 0x5d;
      logging_function_00._M_str = "CDBWrapper";
      logging_function_00._M_len = 10;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_00,source_file_00,0xec,ALL,Info,
                 (ConstevalFormatString<1U>)0xc8d261,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options);
      std::__cxx11::string::~string((string *)&options);
      std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
      pLVar4 = DBContext(this);
      leveldb::DestroyDB((leveldb *)&result,(string *)&options,&pLVar4->options);
      std::__cxx11::string::~string((string *)&options);
      HandleError(&result);
      leveldb::Status::~Status(&result);
    }
    TryCreateDirectories(&params->path);
    std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
    ;
    source_file_01._M_len = 0x5d;
    logging_function_01._M_str = "CDBWrapper";
    logging_function_01._M_len = 10;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_01,source_file_01,0xf1,ALL,Info,(ConstevalFormatString<1U>)0xc8d277,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options);
    std::__cxx11::string::~string((string *)&options);
  }
  pLVar4 = DBContext(this);
  std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
  pLVar6 = DBContext(this);
  leveldb::DB::Open((DB *)&status,&pLVar4->options,(string *)&options,&pLVar6->pdb);
  std::__cxx11::string::~string((string *)&options);
  HandleError(&status);
  source_file_02._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
  ;
  source_file_02._M_len = 0x5d;
  logging_function_02._M_str = "CDBWrapper";
  logging_function_02._M_len = 10;
  LogPrintFormatInternal<>
            (logging_function_02,source_file_02,0xf9,ALL,Info,(ConstevalFormatString<0U>)0xc8d28e);
  if ((params->options).force_compact == true) {
    std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
    ;
    source_file_03._M_len = 0x5d;
    logging_function_03._M_str = "CDBWrapper";
    logging_function_03._M_len = 10;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_03,source_file_03,0xfc,ALL,Info,(ConstevalFormatString<1U>)0xc8d2ab,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options);
    std::__cxx11::string::~string((string *)&options);
    pLVar4 = DBContext(this);
    (*pLVar4->pdb->_vptr_DB[0xb])(pLVar4->pdb,0,0);
    std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
    source_file_04._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
    ;
    source_file_04._M_len = 0x5d;
    logging_function_04._M_str = "CDBWrapper";
    logging_function_04._M_len = 10;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_04,source_file_04,0xfe,ALL,Info,(ConstevalFormatString<1U>)0xc8d2cf,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options);
    std::__cxx11::string::~string((string *)&options);
  }
  result.state_._0_4_ = (uint)result.state_ & 0xffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&options,8,
             (value_type_conflict3 *)&result,(allocator_type *)&new_key);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(value,&options);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&options);
  this_00 = &OBFUSCATE_KEY_KEY_abi_cxx11_;
  bVar3 = Read<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (this,&OBFUSCATE_KEY_KEY_abi_cxx11_,value);
  if ((!bVar3) && (params->obfuscate == true)) {
    bVar3 = IsEmpty(this);
    if (bVar3) {
      CreateObfuscateKey(&new_key,(CDBWrapper *)this_00);
      Write<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (this,&OBFUSCATE_KEY_KEY_abi_cxx11_,&new_key,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(value,&new_key);
      std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
      puVar2 = (this->obfuscate_key).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      s.m_size = (long)(this->obfuscate_key).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar2;
      s.m_data = puVar2;
      HexStr_abi_cxx11_((string *)&result,s);
      source_file_05._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
      ;
      source_file_05._M_len = 0x5d;
      logging_function_05._M_str = "CDBWrapper";
      logging_function_05._M_len = 10;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (logging_function_05,source_file_05,0x10f,ALL,Info,
                 (ConstevalFormatString<2U>)0xc8d2f3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options,
                 (string *)&result);
      std::__cxx11::string::~string((string *)&result);
      std::__cxx11::string::~string((string *)&options);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
  }
  std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
  puVar2 = (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  s_00.m_size = (long)(this->obfuscate_key).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2;
  s_00.m_data = puVar2;
  HexStr_abi_cxx11_((string *)&result,s_00);
  source_file_06._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
  ;
  source_file_06._M_len = 0x5d;
  logging_function_06._M_str = "CDBWrapper";
  logging_function_06._M_len = 10;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function_06,source_file_06,0x112,ALL,Info,(ConstevalFormatString<2U>)0xc8d317,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options,
             (string *)&result);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&options);
  leveldb::Status::~Status(&status);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CDBWrapper::CDBWrapper(const DBParams& params)
    : m_db_context{std::make_unique<LevelDBContext>()}, m_name{fs::PathToString(params.path.stem())}, m_path{params.path}, m_is_memory{params.memory_only}
{
    DBContext().penv = nullptr;
    DBContext().readoptions.verify_checksums = true;
    DBContext().iteroptions.verify_checksums = true;
    DBContext().iteroptions.fill_cache = false;
    DBContext().syncoptions.sync = true;
    DBContext().options = GetOptions(params.cache_bytes);
    DBContext().options.create_if_missing = true;
    if (params.memory_only) {
        DBContext().penv = leveldb::NewMemEnv(leveldb::Env::Default());
        DBContext().options.env = DBContext().penv;
    } else {
        if (params.wipe_data) {
            LogPrintf("Wiping LevelDB in %s\n", fs::PathToString(params.path));
            leveldb::Status result = leveldb::DestroyDB(fs::PathToString(params.path), DBContext().options);
            HandleError(result);
        }
        TryCreateDirectories(params.path);
        LogPrintf("Opening LevelDB in %s\n", fs::PathToString(params.path));
    }
    // PathToString() return value is safe to pass to leveldb open function,
    // because on POSIX leveldb passes the byte string directly to ::open(), and
    // on Windows it converts from UTF-8 to UTF-16 before calling ::CreateFileW
    // (see env_posix.cc and env_windows.cc).
    leveldb::Status status = leveldb::DB::Open(DBContext().options, fs::PathToString(params.path), &DBContext().pdb);
    HandleError(status);
    LogPrintf("Opened LevelDB successfully\n");

    if (params.options.force_compact) {
        LogPrintf("Starting database compaction of %s\n", fs::PathToString(params.path));
        DBContext().pdb->CompactRange(nullptr, nullptr);
        LogPrintf("Finished database compaction of %s\n", fs::PathToString(params.path));
    }

    // The base-case obfuscation key, which is a noop.
    obfuscate_key = std::vector<unsigned char>(OBFUSCATE_KEY_NUM_BYTES, '\000');

    bool key_exists = Read(OBFUSCATE_KEY_KEY, obfuscate_key);

    if (!key_exists && params.obfuscate && IsEmpty()) {
        // Initialize non-degenerate obfuscation if it won't upset
        // existing, non-obfuscated data.
        std::vector<unsigned char> new_key = CreateObfuscateKey();

        // Write `new_key` so we don't obfuscate the key with itself
        Write(OBFUSCATE_KEY_KEY, new_key);
        obfuscate_key = new_key;

        LogPrintf("Wrote new obfuscate key for %s: %s\n", fs::PathToString(params.path), HexStr(obfuscate_key));
    }

    LogPrintf("Using obfuscation key for %s: %s\n", fs::PathToString(params.path), HexStr(obfuscate_key));
}